

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPExternalTransmitter::Create
          (RTPExternalTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  TransmissionProtocol TVar1;
  int iVar2;
  RTPExternalSender *pRVar3;
  int status;
  RTPExternalTransmissionParams *params;
  RTPTransmissionParams *transparams_local;
  size_t maximumpacketsize_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    if (transparams == (RTPTransmissionParams *)0x0) {
      this_local._4_4_ = -0x90;
    }
    else {
      TVar1 = RTPTransmissionParams::GetTransmissionProtocol(transparams);
      if (TVar1 == ExternalProto) {
        this_local._4_4_ = RTPAbortDescriptors::Init(&this->m_abortDesc);
        if (-1 < this_local._4_4_) {
          this->m_abortCount = 0;
          this->maxpacksize = maximumpacketsize;
          pRVar3 = RTPExternalTransmissionParams::GetSender
                             ((RTPExternalTransmissionParams *)transparams);
          this->sender = pRVar3;
          iVar2 = RTPExternalTransmissionParams::GetAdditionalHeaderSize
                            ((RTPExternalTransmissionParams *)transparams);
          this->headersize = iVar2;
          this->localhostname = (uint8_t *)0x0;
          this->localhostnamelength = 0;
          this->waitingfordata = false;
          this->created = true;
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -0x90;
      }
    }
  }
  else {
    this_local._4_4_ = -0x8b;
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
	const RTPExternalTransmissionParams *params;
	int status;

	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ILLEGALPARAMETERS;
	}
	if (transparams->GetTransmissionProtocol() != RTPTransmitter::ExternalProto)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ILLEGALPARAMETERS;
	}
		
	params = (const RTPExternalTransmissionParams *)transparams;

	if ((status = m_abortDesc.Init()) < 0)
	{
		MAINMUTEX_UNLOCK
		return status;
	}
	m_abortCount = 0;
	
	maxpacksize = maximumpacketsize;
	sender = params->GetSender();
	headersize = params->GetAdditionalHeaderSize();

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;
	MAINMUTEX_UNLOCK
	return 0;
}